

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O3

void test_42(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long *plVar15;
  _Alloc_hider _Var16;
  char cVar17;
  int iVar18;
  int iVar19;
  undefined4 uVar20;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  undefined4 extraout_EAX_04;
  undefined4 extraout_EAX_05;
  long *plVar21;
  char *pcVar22;
  long lVar23;
  QPDFObjGen QVar24;
  undefined8 uVar25;
  long *plVar26;
  size_type *psVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  QPDFObjectHandle QVar32;
  QPDFObjectHandle QVar33;
  Pl_Buffer pl1;
  Matrix m1;
  Rectangle r0;
  QPDFObjectHandle array;
  QPDFObjectHandle integer;
  Rectangle r1;
  QPDFObjGen indirect_og;
  QPDFObjectHandle indirect;
  QPDFObjectHandle dictionary;
  QPDFObjectHandle qtest;
  QPDFObjectHandle null;
  QPDFObjectHandle uninitialized;
  QPDFObjectHandle page;
  QPDFObjectHandle rect;
  undefined1 local_298 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  _Alloc_hider _Stack_280;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_270 [2];
  iterator local_248;
  double *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f0;
  double local_1e8;
  double dStack_1e0;
  undefined8 local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  long *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  long local_1b8;
  long lStack_1b0;
  QPDFObjectHandle local_1a8;
  element_type *local_198;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_190;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_188;
  element_type *peStack_180;
  QPDFObjGen local_170;
  BaseHandle local_168;
  string local_158 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  undefined1 local_148 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_130;
  string local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_f0;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  char local_c8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  long *local_48;
  long local_38 [2];
  
  QPDF::getTrailer();
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/QTest","");
  QPDFObjectHandle::getKey((string *)(local_148 + 0x10));
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_248.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Dictionary","");
  QPDFObjectHandle::getKey((string *)&local_1f8);
  p_Var1 = &local_248.m.
            super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  local_248._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/Key2","");
  QPDFObjectHandle::getKey((string *)&local_1d8);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Dictionary","");
  QPDFObjectHandle::getKey(local_158);
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Integer","");
  QPDFObjectHandle::getKey((string *)&local_1a8);
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::newNull();
  cVar17 = QPDFObjectHandle::isArray();
  if (cVar17 == '\0') {
    __assert_fail("array.isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x584,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::aitems();
  QPDFObjectHandle::QPDFArrayItems::begin();
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_298);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar18 = std::__cxx11::string::compare((char *)&local_248);
  if (iVar18 != 0) {
    __assert_fail("i->getName() == \"/Item0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x589,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  plVar21 = (long *)QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)local_298);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator--((iterator *)local_298);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_298);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar18 = std::__cxx11::string::compare((char *)&local_248);
  if (iVar18 != 0) {
    __assert_fail("i->getName() == \"/Item0\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x58c,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_298);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_298);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_298);
  QPDFObjectHandle::QPDFArrayItems::end();
  cVar17 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                     ((iterator *)local_298,(iterator *)&local_248);
  if (cVar17 == '\0') {
    __assert_fail("i == ai.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x590,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&local_248);
  QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)local_298);
  QPDFObjectHandle::QPDFArrayItems::end();
  cVar17 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                     ((iterator *)local_298,(iterator *)&local_248);
  if (cVar17 == '\0') {
    __assert_fail("i == ai.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x592,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&local_248);
  if (*plVar21 != 0) {
    __assert_fail("!i_value",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x593,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::operator--((iterator *)local_298);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar18 = std::__cxx11::string::compare((char *)&local_248);
  if (iVar18 != 0) {
    __assert_fail("i_value.getName() == \"/Item2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x595,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::operator->((iterator *)local_298);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar18 = std::__cxx11::string::compare((char *)&local_248);
  if (iVar18 != 0) {
    __assert_fail("i->getName() == \"/Item2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x596,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)local_298);
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  cVar17 = QPDFObjectHandle::isDictionary();
  if (cVar17 == '\0') {
    __assert_fail("dictionary.isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x598,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::ditems();
  QPDFObjectHandle::QPDFDictItems::begin();
  pcVar22 = (char *)QPDFObjectHandle::QPDFDictItems::iterator::operator->[abi_cxx11_();
  iVar18 = std::__cxx11::string::compare(pcVar22);
  if (iVar18 != 0) {
    __assert_fail("i->first == \"/Key1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x59d,"void test_42(QPDF &, const char *)");
  }
  lVar23 = QPDFObjectHandle::QPDFDictItems::iterator::operator*[abi_cxx11_();
  QPDFObjectHandle::QPDFDictItems::iterator::operator->[abi_cxx11_();
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar18 = std::__cxx11::string::compare((char *)&local_248);
  if (iVar18 != 0) {
    __assert_fail("i->second.getName() == \"/Value1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x59f,"void test_42(QPDF &, const char *)");
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)local_298);
  QPDFObjectHandle::QPDFDictItems::iterator::operator++((iterator *)local_298);
  QPDFObjectHandle::QPDFDictItems::end();
  cVar17 = QPDFObjectHandle::QPDFDictItems::iterator::operator==((iterator *)local_298,&local_248);
  if (cVar17 == '\0') {
    __assert_fail("i == di.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a2,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator(&local_248);
  if (*(long *)(lVar23 + 0x20) != 0) {
    __assert_fail("!i_value.second",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a3,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFDictItems::iterator::~iterator((iterator *)local_298);
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  iVar18 = std::__cxx11::string::compare(local_298);
  if (iVar18 != 0) {
    __assert_fail("\"\" == qtest.getStringValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5a5,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  iVar18 = (int)local_298;
  QPDFObjectHandle::getArrayItem(iVar18);
  QPDFObjectHandle::assertNull();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  QPDFObjectHandle::getArrayItem(iVar18);
  QPDFObjectHandle::assertNull();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  QPDFObjectHandle::getArrayItem(iVar18);
  QPDFObjectHandle::assertNull();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  QPDFObjectHandle::appendItem(&local_1a8);
  QPDFObjectHandle::eraseItem((int)&local_1d8);
  QPDFObjectHandle::eraseItem((int)&local_1d8);
  operator____qpdf(local_298,0x148a81);
  QPDFObjectHandle::insertItem((int)&local_1d8,(QPDFObjectHandle *)0x2a);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  operator____qpdf(local_298,0x148a81);
  QPDFObjectHandle::setArrayItem((int)&local_1d8,(QPDFObjectHandle *)0x2a);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  QPDFObjectHandle::eraseItem((int)&local_1a8);
  QPDFObjectHandle::insertItem((int)&local_1a8,(QPDFObjectHandle *)0x0);
  local_298._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_298._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QPDFObjectHandle::setArrayFromVector((vector *)&local_1a8);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_298);
  QPDFObjectHandle::setArrayItem((int)&local_1a8,(QPDFObjectHandle *)0x0);
  iVar19 = QPDFObjectHandle::getArrayNItems();
  if (iVar19 != 0) {
    __assert_fail("0 == integer.getArrayNItems()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b2,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getArrayAsVector();
  if (local_298._0_8_ != local_298._8_8_) {
    __assert_fail("integer.getArrayAsVector().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b3,"void test_42(QPDF &, const char *)");
  }
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
            ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_298);
  cVar17 = QPDFObjectHandle::getBoolValue();
  if (cVar17 != '\0') {
    __assert_fail("false == integer.getBoolValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b4,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getDictAsMap_abi_cxx11_();
  if (aaStack_270[0]._M_allocated_capacity != 0) {
    __assert_fail("integer.getDictAsMap().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b5,"void test_42(QPDF &, const char *)");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
               *)local_298);
  QPDFObjectHandle::getKeys_abi_cxx11_();
  if (aaStack_270[0]._M_allocated_capacity != 0) {
    __assert_fail("integer.getKeys().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b6,"void test_42(QPDF &, const char *)");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_298);
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Potato","");
  cVar17 = QPDFObjectHandle::hasKey((string *)&local_1a8);
  if (cVar17 != '\0') {
    __assert_fail("false == integer.hasKey(\"/Potato\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5b7,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Potato","");
  QPDFObjectHandle::removeKey((string *)&local_1a8);
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Potato","");
  QPDFObjectHandle::replaceKey((string *)&local_1a8,(QPDFObjectHandle *)local_298);
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Potato","");
  QPDFObjectHandle::newInteger((longlong)&local_248);
  QPDFObjectHandle::replaceKey((string *)&local_1a8,(QPDFObjectHandle *)local_298);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_248.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Integer","");
  QPDFObjectHandle::getKeyIfDict((string *)&local_198);
  local_248._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/Potato","");
  QPDFObjectHandle::getKeyIfDict((string *)&local_1f8);
  QPDFObjectHandle::assertNull();
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Integer","");
  QPDFObjectHandle::getKey((string *)&local_1f8);
  local_248._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/Potato","");
  QPDFObjectHandle::getKeyIfDict(local_58);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/Integer","");
  QPDFObjectHandle::getKey((string *)&local_1f8);
  local_248._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/Potato","");
  QPDFObjectHandle::getKey(local_68);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getInlineImageValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getInlineImageValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5be,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  lVar23 = QPDFObjectHandle::getIntValue();
  if (lVar23 != 0) {
    __assert_fail("0 == dictionary.getIntValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5bf,"void test_42(QPDF &, const char *)");
  }
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar19 = std::__cxx11::string::compare(local_298);
  if (iVar19 != 0) {
    __assert_fail("\"/QPDFFakeName\" == integer.getName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c0,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getOperatorValue_abi_cxx11_();
  iVar19 = std::__cxx11::string::compare(local_298);
  if (iVar19 != 0) {
    __assert_fail("\"QPDFFAKE\" == integer.getOperatorValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c1,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getRealValue_abi_cxx11_();
  iVar19 = std::__cxx11::string::compare(local_298);
  if (iVar19 != 0) {
    __assert_fail("\"0.0\" == dictionary.getRealValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c2,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c3,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("integer.getUTF8Value().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c4,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  dVar28 = (double)QPDFObjectHandle::getNumericValue();
  if ((dVar28 != 0.0) || (NAN(dVar28))) {
    __assert_fail("0.0 == dictionary.getNumericValue()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c5,"void test_42(QPDF &, const char *)");
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"One error\n",10);
  QPDFObjectHandle::getArrayItem((int)&local_248);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("array.getArrayItem(0).getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5c8,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_248.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"One error\n",10);
  local_248._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/Quack","");
  QPDFObjectHandle::getKey((string *)&local_1f8);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("dictionary.getKey(\"/Quack\").getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ca,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_248._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/Quack","");
  QPDFObjectHandle::getKeyIfDict((string *)&local_1f8);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("dictionary.getKeyIfDict(\"/Quack\").getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cb,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  QPDFObjectHandle::getArrayItem(iVar18);
  cVar17 = QPDFObjectHandle::isDictionary();
  if (cVar17 == '\0') {
    __assert_fail("array.getArrayItem(1).isDictionary()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cc,"void test_42(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  QPDFObjectHandle::getArrayItem((int)&local_1f8);
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/K","");
  QPDFObjectHandle::getKey((string *)&local_248);
  cVar17 = QPDFObjectHandle::isArray();
  if (cVar17 == '\0') {
    __assert_fail("array.getArrayItem(1).getKey(\"/K\").isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cd,"void test_42(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_248.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  QPDFObjectHandle::getArrayItem((int)&local_198);
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/K","");
  QPDFObjectHandle::getKey((string *)&local_1f8);
  QPDFObjectHandle::getArrayItem((int)&local_248);
  cVar17 = QPDFObjectHandle::isName();
  if (cVar17 == '\0') {
    __assert_fail("array.getArrayItem(1).getKey(\"/K\").getArrayItem(0).isName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5ce,"void test_42(QPDF &, const char *)");
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_248.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
  }
  QPDFObjectHandle::getArrayItem((int)&local_1c8);
  local_248._vptr_iterator = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/K","");
  QPDFObjectHandle::getKey((string *)&local_198);
  QPDFObjectHandle::getArrayItem((int)&local_1f8);
  QPDFObjectHandle::getName_abi_cxx11_();
  iVar18 = std::__cxx11::string::compare(local_298);
  if (iVar18 != 0) {
    __assert_fail("\"/V\" == array.getArrayItem(1).getKey(\"/K\").getArrayItem(0).getName()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5cf,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
    operator_delete(local_248._vptr_iterator,
                    (ulong)((long)&(local_248.m.
                                    super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Two errors\n",0xb);
  QPDFObjectHandle::getArrayItem((int)&local_248);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    __assert_fail("array.getArrayItem(16059).getStringValue().empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0x5d1,"void test_42(QPDF &, const char *)");
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_248.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"One error\n",10);
  QPDFObjectHandle::getArrayItem((int)&local_198);
  local_298._0_8_ = (element_type *)&local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"/K","");
  QPDFObjectHandle::getKey((string *)&local_1f8);
  QPDFObjectHandle::getArrayItem((int)&local_248);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_248.m.
               super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
    operator_delete((void *)local_298._0_8_,
                    (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
  }
  plVar21 = (long *)QPDF::getAllPages();
  puVar3 = (undefined8 *)*plVar21;
  if ((undefined8 *)plVar21[1] == puVar3) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  else {
    local_d8 = *puVar3;
    local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar3[1];
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_d0->_M_use_count = local_d0->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_d0->_M_use_count = local_d0->_M_use_count + 1;
      }
    }
    local_248._vptr_iterator = (_func_int **)p_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"/Contents","");
    QPDFObjectHandle::getKey((string *)&local_128);
    QPDFObjectHandle::getDict();
    local_1f8 = &local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"/Potato","");
    QPDFObjectHandle::getKey((string *)&local_198);
    QPDFObjectHandle::getName_abi_cxx11_();
    iVar18 = std::__cxx11::string::compare(local_298);
    if (iVar18 == 0) {
      if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
        operator_delete((void *)local_298._0_8_,
                        (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
      }
      if (p_Stack_190 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_190);
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,(long)local_1e8 + 1);
      }
      if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_248._vptr_iterator != p_Var1) {
        operator_delete(local_248._vptr_iterator,
                        (ulong)((long)&(local_248.m.
                                        super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
      uVar20 = QPDFObjectHandle::getArrayAsRectangle();
      auVar4._4_4_ = -(uint)((double)p_Stack_1f0 != 0.0);
      auVar4._0_4_ = -(uint)((double)local_1f8 != 0.0);
      auVar4._8_4_ = -(uint)(local_1e8 != 0.0);
      auVar4._12_4_ = -(uint)(dStack_1e0 != 0.0);
      iVar18 = movmskps(uVar20,auVar4);
      if (iVar18 != 0) {
        __assert_fail("(r0.llx == 0) && (r0.lly == 0) && (r0.urx == 0) && (r0.ury == 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5d9,"void test_42(QPDF &, const char *)");
      }
      local_298._0_8_ = (element_type *)0x3ff3333333333333;
      local_298._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400b333333333333;
      local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4016666666666666;
      _Stack_280._M_p = (pointer)0x401f333333333333;
      QPDFObjectHandle::newFromRectangle((Rectangle *)local_98);
      uVar20 = QPDFObjectHandle::getArrayAsRectangle();
      auVar29._4_4_ = -(uint)((double)p_Stack_190 <= 3.39);
      auVar29._0_4_ = -(uint)((double)local_198 <= 1.19);
      auVar29._8_4_ = -(uint)((double)local_188 <= 5.59);
      auVar29._12_4_ = -(uint)((double)peStack_180 <= 7.79);
      auVar14._4_4_ = -(uint)(3.41 <= (double)p_Stack_190);
      auVar14._0_4_ = -(uint)(1.21 <= (double)local_198);
      auVar14._8_4_ = -(uint)(5.61 <= (double)local_188);
      auVar14._12_4_ = -(uint)(7.81 <= (double)peStack_180);
      iVar18 = movmskps(uVar20,auVar29 | auVar14);
      if (iVar18 != 0) {
        __assert_fail("(r1.llx > 1.19) && (r1.llx < 1.21) && (r1.lly > 3.39) && (r1.lly < 3.41) && (r1.urx > 5.59) && (r1.urx < 5.61) && (r1.ury > 7.79) && (r1.ury < 7.81)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5df,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_298,0x148f76);
      cVar17 = QPDFObjectHandle::isRectangle();
      if (cVar17 != '\0') {
        __assert_fail("!\"[1 2 3 4 5]\"_qpdf.isRectangle()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e0,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
      operator____qpdf((char *)&local_248,0x148f76);
      uVar20 = QPDFObjectHandle::getArrayAsRectangle();
      local_188 = local_288._M_pi;
      peStack_180 = (element_type *)_Stack_280._M_p;
      local_198 = (element_type *)local_298._0_8_;
      p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_248.m.
          super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_248.m.
                   super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        uVar20 = extraout_EAX;
      }
      auVar5._4_4_ = -(uint)((double)p_Stack_1f0 != 0.0);
      auVar5._0_4_ = -(uint)((double)local_1f8 != 0.0);
      auVar5._8_4_ = -(uint)(local_1e8 != 0.0);
      auVar5._12_4_ = -(uint)(dStack_1e0 != 0.0);
      iVar18 = movmskps(uVar20,auVar5);
      if (iVar18 != 0) {
        __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e2,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_298,0x148fdd);
      cVar17 = QPDFObjectHandle::isRectangle();
      if (cVar17 != '\0') {
        __assert_fail("!\"[1 2 3]\"_qpdf.isRectangle()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e3,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
      operator____qpdf((char *)&local_248,0x148fdd);
      uVar20 = QPDFObjectHandle::getArrayAsRectangle();
      local_188 = local_288._M_pi;
      peStack_180 = (element_type *)_Stack_280._M_p;
      local_198 = (element_type *)local_298._0_8_;
      p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_248.m.
          super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_248.m.
                   super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        uVar20 = extraout_EAX_00;
      }
      auVar6._4_4_ = -(uint)((double)p_Stack_1f0 != 0.0);
      auVar6._0_4_ = -(uint)((double)local_1f8 != 0.0);
      auVar6._8_4_ = -(uint)(local_1e8 != 0.0);
      auVar6._12_4_ = -(uint)(dStack_1e0 != 0.0);
      iVar18 = movmskps(uVar20,auVar6);
      if (iVar18 != 0) {
        __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e5,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_298,0x149003);
      cVar17 = QPDFObjectHandle::isRectangle();
      if (cVar17 != '\0') {
        __assert_fail("!\"[1 2 false 4]\"_qpdf.isRectangle()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e6,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
      operator____qpdf((char *)&local_248,0x149003);
      uVar20 = QPDFObjectHandle::getArrayAsRectangle();
      local_188 = local_288._M_pi;
      peStack_180 = (element_type *)_Stack_280._M_p;
      local_198 = (element_type *)local_298._0_8_;
      p_Stack_190 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_248.m.
          super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_248.m.
                   super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr);
        uVar20 = extraout_EAX_01;
      }
      auVar7._4_4_ = -(uint)((double)p_Stack_1f0 != 0.0);
      auVar7._0_4_ = -(uint)((double)local_1f8 != 0.0);
      auVar7._8_4_ = -(uint)(local_1e8 != 0.0);
      auVar7._12_4_ = -(uint)(dStack_1e0 != 0.0);
      iVar18 = movmskps(uVar20,auVar7);
      if (iVar18 != 0) {
        __assert_fail("r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5e8,"void test_42(QPDF &, const char *)");
      }
      local_298._0_8_ = (element_type *)0x3ff3333333333333;
      local_298._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x400b333333333333;
      local_288._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4016666666666666;
      _Stack_280._M_p = (pointer)0x401f333333333333;
      local_278._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x4022333333333333;
      aaStack_270[0]._M_allocated_capacity = 2.3;
      QPDFObjectHandle::newFromMatrix((Matrix *)local_148);
      uVar20 = QPDFObjectHandle::getArrayAsMatrix();
      auVar30._4_4_ =
           -(uint)((double)local_248.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr <= 3.39);
      auVar30._0_4_ = -(uint)((double)local_248._vptr_iterator <= 1.19);
      auVar30._8_4_ =
           -(uint)((double)local_248.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi <= 5.59);
      auVar30._12_4_ = -(uint)((double)local_248.ivalue.first._M_dataplus._M_p <= 7.79);
      auVar8._4_4_ = -(uint)(3.41 <= (double)local_248.m.
                                             super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
      auVar8._0_4_ = -(uint)(1.21 <= (double)local_248._vptr_iterator);
      auVar8._8_4_ = -(uint)(5.61 <= (double)local_248.m.
                                             super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_refcount._M_pi);
      auVar8._12_4_ = -(uint)(7.81 <= (double)local_248.ivalue.first._M_dataplus._M_p);
      iVar18 = movmskps(uVar20,auVar30 | auVar8);
      if ((((iVar18 != 0) || (9.11 <= (double)local_248.ivalue.first._M_string_length)) ||
          (2.31 <= (double)local_248.ivalue.first.field_2._M_allocated_capacity)) ||
         (((double)local_248.ivalue.first._M_string_length <= 9.09 ||
          ((double)local_248.ivalue.first.field_2._M_allocated_capacity <= 2.29)))) {
        __assert_fail("m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 && m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5ef,"void test_42(QPDF &, const char *)");
      }
      cVar17 = QPDFObjectHandle::isMatrix();
      if (cVar17 == '\0') {
        __assert_fail("matrix.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f0,"void test_42(QPDF &, const char *)");
      }
      QPDFMatrix::QPDFMatrix((QPDFMatrix *)local_298,1.2,3.4,5.6,7.8,9.1,2.3);
      QPDFObjectHandle::newFromMatrix((QPDFMatrix *)&local_1c8);
      uVar25 = local_148._8_8_;
      local_148._8_8_ = p_Stack_1c0;
      local_148._0_8_ = local_1c8;
      local_1c8 = (long *)0x0;
      p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25);
        if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
        }
      }
      uVar20 = QPDFObjectHandle::getArrayAsMatrix();
      local_248.ivalue.first._M_string_length = (size_type)local_278._M_pi;
      local_248.ivalue.first.field_2._M_allocated_capacity = aaStack_270[0]._M_allocated_capacity;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_288._M_pi;
      local_248.ivalue.first._M_dataplus._M_p = _Stack_280._M_p;
      local_248._vptr_iterator = (_func_int **)local_298._0_8_;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_298._8_8_;
      auVar31._4_4_ = -(uint)((double)local_298._8_8_ <= 3.39);
      auVar31._0_4_ = -(uint)((double)local_298._0_8_ <= 1.19);
      auVar31._8_4_ = -(uint)((double)local_288._M_pi <= 5.59);
      auVar31._12_4_ = -(uint)((double)_Stack_280._M_p <= 7.79);
      auVar13._4_4_ = -(uint)(3.41 <= (double)local_298._8_8_);
      auVar13._0_4_ = -(uint)(1.21 <= (double)local_298._0_8_);
      auVar13._8_4_ = -(uint)(5.61 <= (double)local_288._M_pi);
      auVar13._12_4_ = -(uint)(7.81 <= (double)_Stack_280._M_p);
      iVar18 = movmskps(uVar20,auVar31 | auVar13);
      if (((iVar18 != 0) || (9.11 <= (double)local_278._M_pi)) ||
         ((2.31 <= (double)aaStack_270[0]._0_8_ ||
          (((double)local_278._M_pi <= 9.09 || ((double)aaStack_270[0]._0_8_ <= 2.29)))))) {
        __assert_fail("m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 && m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f5,"void test_42(QPDF &, const char *)");
      }
      cVar17 = QPDFObjectHandle::isMatrix();
      if (cVar17 == '\0') {
        __assert_fail("matrix.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f6,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_298,0x148f76);
      cVar17 = QPDFObjectHandle::isMatrix();
      if (cVar17 != '\0') {
        __assert_fail("!\"[1 2 3 4 5]\"_qpdf.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f7,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
      operator____qpdf((char *)&local_1c8,0x148f76);
      uVar20 = QPDFObjectHandle::getArrayAsMatrix();
      local_248.ivalue.first._M_string_length = (size_type)local_278._M_pi;
      local_248.ivalue.first.field_2._M_allocated_capacity = aaStack_270[0]._M_allocated_capacity;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_288._M_pi;
      local_248.ivalue.first._M_dataplus._M_p = _Stack_280._M_p;
      local_248._vptr_iterator = (_func_int **)local_298._0_8_;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_298._8_8_;
      if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
        uVar20 = extraout_EAX_02;
      }
      auVar9._4_4_ = -(uint)((double)local_248.m.
                                     super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr != 0.0);
      auVar9._0_4_ = -(uint)((double)local_248._vptr_iterator != 0.0);
      auVar9._8_4_ = -(uint)((double)local_248.m.
                                     super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi != 0.0);
      auVar9._12_4_ = -(uint)((double)local_248.ivalue.first._M_dataplus._M_p != 0.0);
      iVar18 = movmskps(uVar20,auVar9);
      if ((((iVar18 != 0) || ((double)local_248.ivalue.first._M_string_length != 0.0)) ||
          (NAN((double)local_248.ivalue.first._M_string_length))) ||
         (((double)local_248.ivalue.first.field_2._M_allocated_capacity != 0.0 ||
          (NAN((double)local_248.ivalue.first.field_2._M_allocated_capacity))))) {
        __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5f9,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_298,0x149162);
      cVar17 = QPDFObjectHandle::isMatrix();
      if (cVar17 != '\0') {
        __assert_fail("!\"[1 2 3 4 5 6 7]\"_qpdf.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5fa,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
      operator____qpdf((char *)&local_1c8,0x149162);
      uVar20 = QPDFObjectHandle::getArrayAsMatrix();
      local_248.ivalue.first._M_string_length = (size_type)local_278._M_pi;
      local_248.ivalue.first.field_2._M_allocated_capacity = aaStack_270[0]._M_allocated_capacity;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_288._M_pi;
      local_248.ivalue.first._M_dataplus._M_p = _Stack_280._M_p;
      local_248._vptr_iterator = (_func_int **)local_298._0_8_;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_298._8_8_;
      if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
        uVar20 = extraout_EAX_03;
      }
      auVar10._4_4_ =
           -(uint)((double)local_248.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr != 0.0);
      auVar10._0_4_ = -(uint)((double)local_248._vptr_iterator != 0.0);
      auVar10._8_4_ =
           -(uint)((double)local_248.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi != 0.0);
      auVar10._12_4_ = -(uint)((double)local_248.ivalue.first._M_dataplus._M_p != 0.0);
      iVar18 = movmskps(uVar20,auVar10);
      if (((iVar18 != 0) || ((double)local_248.ivalue.first._M_string_length != 0.0)) ||
         ((NAN((double)local_248.ivalue.first._M_string_length) ||
          (((double)local_248.ivalue.first.field_2._M_allocated_capacity != 0.0 ||
           (NAN((double)local_248.ivalue.first.field_2._M_allocated_capacity))))))) {
        __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5fc,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_298,0x149195);
      cVar17 = QPDFObjectHandle::isMatrix();
      if (cVar17 != '\0') {
        __assert_fail("!\"[1 2 3 false 5 6 7]\"_qpdf.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5fd,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
      operator____qpdf((char *)&local_1c8,0x149195);
      uVar20 = QPDFObjectHandle::getArrayAsMatrix();
      local_248.ivalue.first._M_string_length = (size_type)local_278._M_pi;
      local_248.ivalue.first.field_2._M_allocated_capacity = aaStack_270[0]._M_allocated_capacity;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_288._M_pi;
      local_248.ivalue.first._M_dataplus._M_p = _Stack_280._M_p;
      local_248._vptr_iterator = (_func_int **)local_298._0_8_;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_298._8_8_;
      if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
        uVar20 = extraout_EAX_04;
      }
      auVar11._4_4_ =
           -(uint)((double)local_248.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr != 0.0);
      auVar11._0_4_ = -(uint)((double)local_248._vptr_iterator != 0.0);
      auVar11._8_4_ =
           -(uint)((double)local_248.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi != 0.0);
      auVar11._12_4_ = -(uint)((double)local_248.ivalue.first._M_dataplus._M_p != 0.0);
      iVar18 = movmskps(uVar20,auVar11);
      if ((((iVar18 != 0) || ((double)local_248.ivalue.first._M_string_length != 0.0)) ||
          (NAN((double)local_248.ivalue.first._M_string_length))) ||
         (((double)local_248.ivalue.first.field_2._M_allocated_capacity != 0.0 ||
          (NAN((double)local_248.ivalue.first.field_2._M_allocated_capacity))))) {
        __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x5ff,"void test_42(QPDF &, const char *)");
      }
      operator____qpdf(local_298,0x14932c);
      cVar17 = QPDFObjectHandle::isMatrix();
      if (cVar17 != '\0') {
        __assert_fail("!\"42\"_qpdf.isMatrix()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x600,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
      }
      operator____qpdf((char *)&local_1c8,0x14932c);
      uVar20 = QPDFObjectHandle::getArrayAsMatrix();
      local_248.ivalue.first._M_string_length = (size_type)local_278._M_pi;
      local_248.ivalue.first.field_2._M_allocated_capacity = aaStack_270[0]._M_allocated_capacity;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = local_288._M_pi;
      local_248.ivalue.first._M_dataplus._M_p = _Stack_280._M_p;
      local_248._vptr_iterator = (_func_int **)local_298._0_8_;
      local_248.m.
      super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_298._8_8_;
      if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
        uVar20 = extraout_EAX_05;
      }
      auVar12._4_4_ =
           -(uint)((double)local_248.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr != 0.0);
      auVar12._0_4_ = -(uint)((double)local_248._vptr_iterator != 0.0);
      auVar12._8_4_ =
           -(uint)((double)local_248.m.
                           super___shared_ptr<QPDFObjectHandle::QPDFDictItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi != 0.0);
      auVar12._12_4_ = -(uint)((double)local_248.ivalue.first._M_dataplus._M_p != 0.0);
      iVar18 = movmskps(uVar20,auVar12);
      if (((iVar18 != 0) || ((double)local_248.ivalue.first._M_string_length != 0.0)) ||
         ((NAN((double)local_248.ivalue.first._M_string_length) ||
          (((double)local_248.ivalue.first.field_2._M_allocated_capacity != 0.0 ||
           (NAN((double)local_248.ivalue.first.field_2._M_allocated_capacity))))))) {
        __assert_fail("m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x602,"void test_42(QPDF &, const char *)");
      }
      local_f8 = 0;
      p_Stack_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cVar17 = QPDFObjectHandle::isInteger();
      if (cVar17 != '\0') {
        __assert_fail("!uninitialized.isInteger()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x607,"void test_42(QPDF &, const char *)");
      }
      cVar17 = QPDFObjectHandle::isDictionary();
      if (cVar17 != '\0') {
        __assert_fail("!uninitialized.isDictionary()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x608,"void test_42(QPDF &, const char *)");
      }
      cVar17 = QPDFObjectHandle::isScalar();
      if (cVar17 != '\0') {
        __assert_fail("!uninitialized.isScalar()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x609,"void test_42(QPDF &, const char *)");
      }
      QPDF::newIndirectNull();
      local_170 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
      QVar24 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_168);
      local_e8 = local_1d8;
      local_e0 = local_1d0;
      if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1d0->_M_use_count = local_1d0->_M_use_count + 1;
        }
      }
      QVar32.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_e8;
      QVar32.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)QVar24;
      QPDF::replaceObject((QPDFObjGen)pdf,QVar32);
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
      }
      cVar17 = QPDFObjectHandle::isIndirect();
      if (cVar17 == '\0') {
        __assert_fail("array.isIndirect()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x60f,"void test_42(QPDF &, const char *)");
      }
      cVar17 = QPDFObjectHandle::isArray();
      if (cVar17 == '\0') {
        __assert_fail("indirect.isArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x610,"void test_42(QPDF &, const char *)");
      }
      uVar25 = QPDFObjectHandle::getObjGen();
      if ((local_170.obj != (int)uVar25) || (local_170.gen != (int)((ulong)uVar25 >> 0x20))) {
        __assert_fail("array.getObjGen() == indirect_og",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x611,"void test_42(QPDF &, const char *)");
      }
      cVar17 = QPDFObjectHandle::isArray();
      if (cVar17 == '\0') {
        __assert_fail("array.isArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x612,"void test_42(QPDF &, const char *)");
      }
      cVar17 = QPDFObjectHandle::isArray();
      if (cVar17 == '\0') {
        __assert_fail("indirect.isArray()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x613,"void test_42(QPDF &, const char *)");
      }
      QPDFObjectHandle::unparse_abi_cxx11_();
      QPDFObjGen::unparse_abi_cxx11_(&local_128,&local_170,' ');
      plVar21 = (long *)std::__cxx11::string::append((char *)&local_128);
      plVar26 = plVar21 + 2;
      if ((long *)*plVar21 == plVar26) {
        local_1b8 = *plVar26;
        lStack_1b0 = plVar21[3];
        local_1c8 = &local_1b8;
      }
      else {
        local_1b8 = *plVar26;
        local_1c8 = (long *)*plVar21;
      }
      plVar15 = local_1c8;
      p_Stack_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar21[1];
      *plVar21 = (long)plVar26;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ != p_Stack_1c0) {
LAB_00123cf9:
        __assert_fail("indirect.unparse() == indirect_og.unparse(\' \') + \" R\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x614,"void test_42(QPDF &, const char *)");
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar18 = bcmp((void *)local_298._0_8_,local_1c8,local_298._8_8_);
        if (iVar18 != 0) goto LAB_00123cf9;
      }
      if (plVar15 != &local_1b8) {
        operator_delete(plVar15,local_1b8 + 1);
      }
      paVar2 = &local_128.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar2) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      if ((element_type *)local_298._0_8_ != (element_type *)&local_288) {
        operator_delete((void *)local_298._0_8_,
                        (ulong)((long)&(local_288._M_pi)->_vptr__Sp_counted_base + 1));
      }
      Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_298,"",(Pipeline *)0x0);
      QPDFObjectHandle::writeJSON((int)&local_1d8,(Pipeline *)0x2,SUB81(local_298,0),1);
      Pl_Buffer::finish();
      Pl_Buffer::getString_abi_cxx11_();
      QPDFObjGen::unparse_abi_cxx11_((string *)(local_98 + 0x10),&local_170,' ');
      plVar21 = (long *)std::__cxx11::string::replace
                                  ((ulong)(local_98 + 0x10),0,(char *)0x0,0x149bca);
      plVar26 = plVar21 + 2;
      if ((long *)*plVar21 == plVar26) {
        local_a8 = *plVar26;
        lStack_a0 = plVar21[3];
        local_b8 = &local_a8;
      }
      else {
        local_a8 = *plVar26;
        local_b8 = (long *)*plVar21;
      }
      local_b0 = plVar21[1];
      *plVar21 = (long)plVar26;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      plVar21 = (long *)std::__cxx11::string::append((char *)&local_b8);
      psVar27 = (size_type *)(plVar21 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar21 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar27) {
        local_128.field_2._M_allocated_capacity = *psVar27;
        local_128.field_2._8_8_ = plVar21[3];
        local_128._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_128.field_2._M_allocated_capacity = *psVar27;
        local_128._M_dataplus._M_p = (pointer)*plVar21;
      }
      _Var16._M_p = local_128._M_dataplus._M_p;
      local_128._M_string_length = plVar21[1];
      *plVar21 = (long)psVar27;
      plVar21[1] = 0;
      *(undefined1 *)(plVar21 + 2) = 0;
      if (p_Stack_1c0 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length)
      {
        if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          iVar18 = bcmp(local_1c8,local_128._M_dataplus._M_p,(size_t)p_Stack_1c0);
          if (iVar18 != 0) goto LAB_00123d18;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var16._M_p != paVar2) {
          operator_delete(_Var16._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._16_8_ != &local_78) {
          operator_delete((void *)local_98._16_8_,local_78._M_allocated_capacity + 1);
        }
        if (local_1c8 != &local_1b8) {
          operator_delete(local_1c8,local_1b8 + 1);
        }
        operator____qpdf((char *)&local_1c8,0x14932c);
        QPDFObjectHandle::setArrayItem((int)&local_1d8,(QPDFObjectHandle *)0x1);
        if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
        }
        QPDFObjectHandle::getArrayItem((int)&local_1c8);
        lVar23 = QPDFObjectHandle::getIntValue();
        if (lVar23 == 0x2a) {
          if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
          }
          QVar24 = qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&local_168);
          operator____qpdf(local_c8,0x14932c);
          QVar33.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8;
          QVar33.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)QVar24;
          QPDF::replaceObject((QPDFObjGen)pdf,QVar33);
          if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
          }
          cVar17 = QPDFObjectHandle::isInteger();
          if (cVar17 != '\0') {
            Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_298);
            if (local_168.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_168.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (p_Stack_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_f0);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
            }
            if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
            }
            if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
            }
            if (local_1a8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1a8.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
            }
            if (local_1d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0);
            }
            if (local_130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130);
            }
            return;
          }
          __assert_fail("array.isInteger()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                        ,0x61f,"void test_42(QPDF &, const char *)");
        }
        __assert_fail("indirect.getArrayItem(1).getIntValue() == 42",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                      ,0x61c,"void test_42(QPDF &, const char *)");
      }
LAB_00123d18:
      __assert_fail("pl1.getString() == std::string(\"\\\"\" + indirect_og.unparse(\' \') + \" R\\\"\")"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                    ,0x619,"void test_42(QPDF &, const char *)");
    }
  }
  __assert_fail("\"/QPDFFakeName\" == page.getKey(\"/Contents\").getDict().getKey(\"/Potato\").getName()"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0x5d6,"void test_42(QPDF &, const char *)");
}

Assistant:

static void
test_42(QPDF& pdf, char const* arg2)
{
    // Access objects as wrong type. This test case is crafted to work with object-types.pdf.
    QPDFObjectHandle qtest = pdf.getTrailer().getKey("/QTest");
    QPDFObjectHandle array = qtest.getKey("/Dictionary").getKey("/Key2");
    QPDFObjectHandle dictionary = qtest.getKey("/Dictionary");
    QPDFObjectHandle integer = qtest.getKey("/Integer");
    QPDFObjectHandle null = QPDFObjectHandle::newNull();
    assert(array.isArray());
    {
        // Exercise iterators directly
        auto ai = array.aitems();
        auto i = ai.begin();
        assert(i->getName() == "/Item0");
        auto& i_value = *i;
        --i;
        assert(i->getName() == "/Item0");
        ++i;
        ++i;
        ++i;
        assert(i == ai.end());
        ++i;
        assert(i == ai.end());
        assert(!i_value);
        --i;
        assert(i_value.getName() == "/Item2");
        assert(i->getName() == "/Item2");
    }
    assert(dictionary.isDictionary());
    {
        // Exercise iterators directly
        auto di = dictionary.ditems();
        auto i = di.begin();
        assert(i->first == "/Key1");
        auto& i_value = *i;
        assert(i->second.getName() == "/Value1");
        ++i;
        ++i;
        assert(i == di.end());
        assert(!i_value.second);
    }
    assert("" == qtest.getStringValue());
    array.getArrayItem(-1).assertNull();
    array.getArrayItem(16059).assertNull();
    integer.getArrayItem(0).assertNull();
    integer.appendItem(null);
    array.eraseItem(-1);
    array.eraseItem(16059);
    array.insertItem(42, "/Dontpanic"_qpdf);
    array.setArrayItem(42, "/Dontpanic"_qpdf);
    integer.eraseItem(0);
    integer.insertItem(0, null);
    integer.setArrayFromVector(std::vector<QPDFObjectHandle>());
    integer.setArrayItem(0, null);
    assert(0 == integer.getArrayNItems());
    assert(integer.getArrayAsVector().empty());
    assert(false == integer.getBoolValue());
    assert(integer.getDictAsMap().empty());
    assert(integer.getKeys().empty());
    assert(false == integer.hasKey("/Potato"));
    integer.removeKey("/Potato");
    integer.replaceKey("/Potato", null);
    integer.replaceKey("/Potato", QPDFObjectHandle::newInteger(1));
    null.getKeyIfDict("/Integer").getKeyIfDict("/Potato").assertNull();
    qtest.getKey("/Integer").getKeyIfDict("/Potato");
    qtest.getKey("/Integer").getKey("/Potato");
    assert(integer.getInlineImageValue().empty());
    assert(0 == dictionary.getIntValue());
    assert("/QPDFFakeName" == integer.getName());
    assert("QPDFFAKE" == integer.getOperatorValue());
    assert("0.0" == dictionary.getRealValue());
    assert(integer.getStringValue().empty());
    assert(integer.getUTF8Value().empty());
    assert(0.0 == dictionary.getNumericValue());
    // Make sure error messages are okay for nested values
    std::cerr << "One error\n";
    assert(array.getArrayItem(0).getStringValue().empty());
    std::cerr << "One error\n";
    assert(dictionary.getKey("/Quack").getStringValue().empty());
    assert(dictionary.getKeyIfDict("/Quack").getStringValue().empty());
    assert(array.getArrayItem(1).isDictionary());
    assert(array.getArrayItem(1).getKey("/K").isArray());
    assert(array.getArrayItem(1).getKey("/K").getArrayItem(0).isName());
    assert("/V" == array.getArrayItem(1).getKey("/K").getArrayItem(0).getName());
    std::cerr << "Two errors\n";
    assert(array.getArrayItem(16059).getStringValue().empty());
    std::cerr << "One error\n";
    array.getArrayItem(1).getKey("/K").getArrayItem(0).getStringValue();
    // Stream dictionary
    QPDFObjectHandle page = pdf.getAllPages().at(0);
    assert("/QPDFFakeName" == page.getKey("/Contents").getDict().getKey("/Potato").getName());
    // Rectangle
    QPDFObjectHandle::Rectangle r0 = integer.getArrayAsRectangle();
    assert((r0.llx == 0) && (r0.lly == 0) && (r0.urx == 0) && (r0.ury == 0));
    QPDFObjectHandle rect =
        QPDFObjectHandle::newFromRectangle(QPDFObjectHandle::Rectangle(1.2, 3.4, 5.6, 7.8));
    QPDFObjectHandle::Rectangle r1 = rect.getArrayAsRectangle();
    assert(
        (r1.llx > 1.19) && (r1.llx < 1.21) && (r1.lly > 3.39) && (r1.lly < 3.41) &&
        (r1.urx > 5.59) && (r1.urx < 5.61) && (r1.ury > 7.79) && (r1.ury < 7.81));
    assert(!"[1 2 3 4 5]"_qpdf.isRectangle());
    r1 = "[1 2 3 4 5]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    assert(!"[1 2 3]"_qpdf.isRectangle());
    r1 = "[1 2 3]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    assert(!"[1 2 false 4]"_qpdf.isRectangle());
    r1 = "[1 2 false 4]"_qpdf.getArrayAsRectangle();
    assert(r0.llx == 0 && r0.lly == 0 && r0.urx == 0 && r0.ury == 0);
    // Matrix
    auto matrix =
        QPDFObjectHandle::newFromMatrix(QPDFObjectHandle::Matrix{1.2, 3.4, 5.6, 7.8, 9.1, 2.3});
    auto m1 = matrix.getArrayAsMatrix();
    assert(
        m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 &&
        m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31);
    assert(matrix.isMatrix());
    matrix = QPDFObjectHandle::newFromMatrix(QPDFMatrix{1.2, 3.4, 5.6, 7.8, 9.1, 2.3});
    m1 = matrix.getArrayAsMatrix();
    assert(
        m1.a > 1.19 && m1.a < 1.21 && m1.b > 3.39 && m1.b < 3.41 && m1.c > 5.59 && m1.c < 5.61 &&
        m1.d > 7.79 && m1.d < 7.81 && m1.e > 9.09 && m1.e < 9.11 && m1.f > 2.29 && m1.f < 2.31);
    assert(matrix.isMatrix());
    assert(!"[1 2 3 4 5]"_qpdf.isMatrix());
    m1 = "[1 2 3 4 5]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"[1 2 3 4 5 6 7]"_qpdf.isMatrix());
    m1 = "[1 2 3 4 5 6 7]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"[1 2 3 false 5 6 7]"_qpdf.isMatrix());
    m1 = "[1 2 3 false 5 6 7]"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);
    assert(!"42"_qpdf.isMatrix());
    m1 = "42"_qpdf.getArrayAsMatrix();
    assert(m1.a == 0 && m1.b == 0 && m1.c == 0 && m1.d == 0 && m1.e == 0 && m1.f == 0);

    // Uninitialized
    QPDFObjectHandle uninitialized;
    assert(!uninitialized);
    assert(!uninitialized.isInteger());
    assert(!uninitialized.isDictionary());
    assert(!uninitialized.isScalar());

    // Reference
    auto indirect = pdf.newIndirectNull();
    QPDFObjGen indirect_og{indirect.getObjGen()};
    pdf.replaceObject(indirect, array);
    assert(array.isIndirect());
    assert(indirect.isArray());
    assert(array.getObjGen() == indirect_og);
    assert(array.isArray());
    assert(indirect.isArray());
    assert(indirect.unparse() == indirect_og.unparse(' ') + " R");

    auto pl1 = Pl_Buffer("");
    array.writeJSON(2, &pl1, true);
    pl1.finish();
    assert(pl1.getString() == std::string("\"" + indirect_og.unparse(' ') + " R\""));

    array.setArrayItem(1, "42"_qpdf);
    assert(indirect.getArrayItem(1).getIntValue() == 42);

    pdf.replaceObject(indirect, "42"_qpdf);
    assert(array.isInteger());
}